

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::getGlobalReferenceIndex
          (Compiler *this,string *reference_name,ReturnType t,ImageObject *object,uint16_t *index,
          Class **_class)

{
  bool bVar1;
  iterator iVar2;
  uint *puVar3;
  uint16_t j;
  ushort uVar4;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_metadata->global_references)._M_h,reference_name);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
       ._M_cur == (__node_type *)0x0) ||
     ((t != ANY &&
      (*(ReturnType *)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
               ._M_cur + 0x70) != t)))) {
    bVar1 = false;
  }
  else {
    *_class = (Class *)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                              ._M_cur + 0x30);
    for (uVar4 = 0; (ulong)uVar4 < (ulong)(*(long *)(object + 0x28) - *(long *)(object + 0x20) >> 2)
        ; uVar4 = uVar4 + 1) {
      puVar3 = r_code::vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)(object + 0x20),(ulong)uVar4);
      if (*(ulong *)((long)iVar2.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                           ._M_cur + 0x28) == (ulong)*puVar3) goto LAB_00132851;
    }
    r_code::vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)(object + 0x20),
               *(uint *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_true>
                               ._M_cur + 0x28));
    uVar4 = (short)((uint)(*(int *)(object + 0x28) - *(int *)(object + 0x20)) >> 2) - 1;
LAB_00132851:
    *index = uVar4;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Compiler::getGlobalReferenceIndex(const std::string reference_name, const ReturnType t, ImageObject *object, uint16_t &index, Class *&_class)
{
    std::unordered_map<std::string, Reference>::iterator it = _metadata->global_references.find(reference_name);

    if (it != _metadata->global_references.end() && (t == ANY || (t != ANY && it->second._class.type == t))) {
        _class = &it->second._class;

        for (uint16_t j = 0; j < object->references.size(); ++j)
            if (object->references[j] == it->second.index) { // the object has already been referenced.
                index = j; // rptr points to object->reference_set[j], which in turn points to it->second.index.
                return true;
            }

        object->references.push_back(it->second.index); // add new reference to the object.
        index = object->references.size() - 1; // rptr points to the last element of object->reference_set, which in turn points to it->second.index.
        return true;
    }

    return false;
}